

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::
insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (BlockPatternMatchVector *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  size_type __new_size;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)last._M_current - (long)first._M_current;
  __new_size = ((long)uVar1 / 0x40 + 1) - (ulong)((uVar1 & 0x3f) == 0);
  this->m_block_count = __new_size;
  duckdb::std::
  vector<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
  ::resize(&this->m_map,__new_size);
  duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->m_extendedAscii,
             this->m_block_count << 8);
  uVar2 = 0;
  if ((long)uVar1 < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    insert<char>(this,uVar2 >> 6,first._M_current[uVar2],(uint)uVar2 & 0x3f);
  }
  return;
}

Assistant:

void insert(InputIt1 first, InputIt1 last)
    {
        int64_t len = std::distance(first, last);
        m_block_count = ceildiv(len, 64);
        m_map.resize(static_cast<size_t>(m_block_count));
        m_extendedAscii.resize(static_cast<size_t>(m_block_count * 256));

        for (int64_t i = 0; i < len; ++i) {
            int64_t block = i / 64;
            int64_t pos = i % 64;
            insert(block, first[i], static_cast<int>(pos));
        }
    }